

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::encode_bc4(void *pDst,uint8_t *pPixels,uint32_t stride)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  
  bVar1 = *pPixels;
  bVar2 = pPixels[stride];
  bVar3 = pPixels[stride * 2];
  bVar4 = pPixels[stride * 4];
  bVar5 = bVar4;
  uVar7 = (uint)bVar1;
  if ((uint)bVar4 < (uint)bVar1) {
    bVar5 = bVar1;
    uVar7 = (uint)bVar4;
  }
  bVar1 = pPixels[stride * 5];
  bVar4 = bVar1;
  uVar35 = (uint)bVar2;
  if ((uint)bVar1 < (uint)bVar2) {
    bVar4 = bVar2;
    uVar35 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 6];
  bVar2 = bVar1;
  uVar8 = (uint)bVar3;
  if ((uint)bVar1 < (uint)bVar3) {
    bVar2 = bVar3;
    uVar8 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 3];
  bVar3 = pPixels[stride * 7];
  bVar6 = bVar3;
  uVar9 = (uint)bVar1;
  if ((uint)bVar3 < (uint)bVar1) {
    bVar6 = bVar1;
    uVar9 = (uint)bVar3;
  }
  bVar1 = pPixels[stride * 8];
  if (bVar1 <= uVar7) {
    uVar7 = (uint)bVar1;
  }
  uVar30 = (uint)bVar5;
  if ((uint)bVar5 <= (uint)bVar1) {
    uVar30 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 9];
  if (bVar1 <= uVar35) {
    uVar35 = (uint)bVar1;
  }
  uVar32 = (uint)bVar4;
  if ((uint)bVar4 <= (uint)bVar1) {
    uVar32 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 10];
  if (bVar1 <= uVar8) {
    uVar8 = (uint)bVar1;
  }
  uVar10 = (uint)bVar2;
  if ((uint)bVar2 <= (uint)bVar1) {
    uVar10 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 0xb];
  if (bVar1 <= uVar9) {
    uVar9 = (uint)bVar1;
  }
  uVar11 = (uint)bVar6;
  if ((uint)bVar6 <= (uint)bVar1) {
    uVar11 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 0xc];
  if (bVar1 <= uVar7) {
    uVar7 = (uint)bVar1;
  }
  if (uVar30 <= bVar1) {
    uVar30 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 0xd];
  if (bVar1 <= uVar35) {
    uVar35 = (uint)bVar1;
  }
  if (uVar32 <= bVar1) {
    uVar32 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 0xe];
  if (bVar1 <= uVar8) {
    uVar8 = (uint)bVar1;
  }
  if (uVar10 <= bVar1) {
    uVar10 = (uint)bVar1;
  }
  bVar1 = pPixels[stride * 0xf];
  if (bVar1 <= uVar9) {
    uVar9 = (uint)bVar1;
  }
  if (uVar11 <= bVar1) {
    uVar11 = (uint)bVar1;
  }
  if (uVar7 < uVar35) {
    uVar35 = uVar7;
  }
  if (uVar8 <= uVar35) {
    uVar35 = uVar8;
  }
  if (uVar9 <= uVar35) {
    uVar35 = uVar9;
  }
  if (uVar32 < uVar30) {
    uVar32 = uVar30;
  }
  if (uVar32 <= uVar10) {
    uVar32 = uVar10;
  }
  if (uVar32 <= uVar11) {
    uVar32 = uVar11;
  }
  *(char *)pDst = (char)uVar32;
  *(char *)((long)pDst + 1) = (char)uVar35;
  iVar36 = uVar32 - uVar35;
  if (iVar36 == 0) {
    *(undefined2 *)((long)pDst + 6) = 0;
    *(undefined4 *)((long)pDst + 2) = 0;
  }
  else {
    bVar1 = *pPixels;
    bVar2 = pPixels[stride];
    bVar3 = pPixels[stride * 2];
    bVar4 = pPixels[stride * 3];
    iVar12 = iVar36 * 7;
    iVar38 = uVar35 * -0xe;
    iVar29 = ((uint)bVar1 * 0x10 - ((uint)bVar1 + (uint)bVar1)) + iVar38 + 4;
    iVar13 = iVar36 * 3;
    iVar16 = iVar36 * 0xd;
    iVar14 = iVar36 * 5;
    iVar17 = iVar36 * 0xb;
    iVar15 = iVar36 * 9;
    iVar18 = ((uint)bVar2 * 0x10 - ((uint)bVar2 + (uint)bVar2)) + iVar38 + 4;
    iVar19 = ((uint)bVar3 * 0x10 - ((uint)bVar3 + (uint)bVar3)) + iVar38 + 4;
    iVar20 = ((uint)bVar4 * 0x10 - ((uint)bVar4 + (uint)bVar4)) + iVar38 + 4;
    bVar1 = pPixels[stride * 4];
    bVar2 = pPixels[stride * 5];
    bVar3 = pPixels[stride * 6];
    bVar4 = pPixels[stride * 7];
    iVar31 = ((uint)bVar1 * 0x10 - ((uint)bVar1 + (uint)bVar1)) + iVar38 + 4;
    iVar21 = ((uint)bVar2 * 0x10 - ((uint)bVar2 + (uint)bVar2)) + iVar38 + 4;
    iVar22 = ((uint)bVar3 * 0x10 - ((uint)bVar3 + (uint)bVar3)) + iVar38 + 4;
    iVar23 = ((uint)bVar4 * 0x10 - ((uint)bVar4 + (uint)bVar4)) + iVar38 + 4;
    bVar1 = pPixels[stride * 8];
    bVar2 = pPixels[stride * 9];
    bVar3 = pPixels[stride * 10];
    bVar4 = pPixels[stride * 0xb];
    iVar34 = ((uint)bVar1 * 0x10 - ((uint)bVar1 + (uint)bVar1)) + iVar38 + 4;
    iVar24 = ((uint)bVar2 * 0x10 - ((uint)bVar2 + (uint)bVar2)) + iVar38 + 4;
    iVar25 = ((uint)bVar3 * 0x10 - ((uint)bVar3 + (uint)bVar3)) + iVar38 + 4;
    iVar26 = ((uint)bVar4 * 0x10 - ((uint)bVar4 + (uint)bVar4)) + iVar38 + 4;
    bVar1 = pPixels[stride * 0xc];
    bVar2 = pPixels[stride * 0xd];
    bVar3 = pPixels[stride * 0xf];
    iVar37 = ((uint)bVar1 * 0x10 - ((uint)bVar1 + (uint)bVar1)) + iVar38 + 4;
    iVar27 = ((uint)bVar2 * 0x10 - ((uint)bVar2 + (uint)bVar2)) + iVar38 + 4;
    iVar33 = iVar38 + (uint)pPixels[stride * 0xe] * 0x10 + (uint)pPixels[stride * 0xe] * -2 + 4;
    iVar38 = ((uint)bVar3 * 0x10 - ((uint)bVar3 + (uint)bVar3)) + iVar38 + 4;
    uVar7 = encode_bc4::s_tran2
            [(ulong)(iVar36 <= iVar33) + (ulong)(iVar13 <= iVar33) + (ulong)(iVar14 <= iVar33) +
             (ulong)(iVar12 <= iVar33) + (ulong)(iVar15 <= iVar33) +
             (ulong)(iVar17 <= iVar33) + (ulong)(iVar16 <= iVar33)];
    uVar30 = encode_bc4::s_tran0
             [(ulong)(iVar36 <= iVar34) +
              (ulong)(iVar13 <= iVar34) +
              (ulong)(SBORROW4(iVar34,iVar14) == iVar34 + iVar36 * -5 < 0) +
              (ulong)(SBORROW4(iVar34,iVar12) == iVar34 + iVar36 * -7 < 0) +
              (ulong)(iVar15 <= iVar34) + (ulong)(iVar17 <= iVar34) + (ulong)(iVar16 <= iVar34)] |
             encode_bc4::s_tran1
             [(ulong)(iVar36 <= iVar24) +
              (ulong)(iVar13 <= iVar24) +
              (ulong)(SBORROW4(iVar24,iVar14) == iVar24 + iVar36 * -5 < 0) +
              (ulong)(iVar12 <= iVar24) + (ulong)(iVar15 <= iVar24) +
              (ulong)(iVar17 <= iVar24) + (ulong)(iVar16 <= iVar24)] |
             encode_bc4::s_tran2
             [(ulong)(iVar36 <= iVar25) +
              (ulong)(iVar13 <= iVar25) +
              (ulong)(SBORROW4(iVar25,iVar14) == iVar25 + iVar36 * -5 < 0) +
              (ulong)(iVar12 <= iVar25) + (ulong)(iVar15 <= iVar25) +
              (ulong)(iVar17 <= iVar25) + (ulong)(iVar16 <= iVar25)] |
             encode_bc4::s_tran3
             [(ulong)(iVar36 <= iVar26) +
              (ulong)(iVar13 <= iVar26) +
              (ulong)(SBORROW4(iVar26,iVar14) == iVar26 + iVar36 * -5 < 0) +
              (ulong)(iVar12 <= iVar26) + (ulong)(iVar15 <= iVar26) +
              (ulong)(iVar17 <= iVar26) + (ulong)(iVar16 <= iVar26)];
    uVar35 = encode_bc4::s_tran3
             [(ulong)(iVar36 <= iVar38) + (ulong)(iVar13 <= iVar38) + (ulong)(iVar14 <= iVar38) +
              (ulong)(iVar12 <= iVar38) + (ulong)(iVar15 <= iVar38) +
              (ulong)(iVar17 <= iVar38) + (ulong)(iVar16 <= iVar38)];
    uVar8 = encode_bc4::s_tran1
            [(ulong)(iVar36 <= iVar27) + (ulong)(iVar13 <= iVar27) + (ulong)(iVar14 <= iVar27) +
             (ulong)(iVar12 <= iVar27) + (ulong)(iVar15 <= iVar27) +
             (ulong)(iVar17 <= iVar27) + (ulong)(iVar16 <= iVar27)];
    uVar9 = encode_bc4::s_tran0
            [(ulong)(iVar36 <= iVar37) +
             (ulong)(iVar13 <= iVar37) +
             (ulong)(SBORROW4(iVar37,iVar14) == iVar37 + iVar36 * -5 < 0) +
             (ulong)(iVar12 <= iVar37) + (ulong)(iVar15 <= iVar37) +
             (ulong)(iVar17 <= iVar37) + (ulong)(iVar16 <= iVar37)];
    uVar32 = encode_bc4::s_tran3
             [(ulong)(iVar36 <= iVar23) +
              (ulong)(iVar13 <= iVar23) +
              (ulong)(SBORROW4(iVar23,iVar14) == iVar23 + iVar36 * -5 < 0) +
              (ulong)(SBORROW4(iVar23,iVar12) == iVar23 + iVar36 * -7 < 0) +
              (ulong)(iVar15 <= iVar23) + (ulong)(iVar17 <= iVar23) + (ulong)(iVar16 <= iVar23)] <<
             0xc | encode_bc4::s_tran3
                   [(ulong)(iVar36 <= iVar20) +
                    (ulong)(SBORROW4(iVar20,iVar13) == iVar20 + iVar36 * -3 < 0) +
                    (ulong)(SBORROW4(iVar20,iVar14) == iVar20 + iVar36 * -5 < 0) +
                    (ulong)(SBORROW4(iVar20,iVar12) == iVar20 + iVar36 * -7 < 0) +
                    (ulong)(SBORROW4(iVar20,iVar15) == iVar20 + iVar36 * -9 < 0) +
                    (ulong)(iVar17 <= iVar20) + (ulong)(iVar16 <= iVar20)] |
             encode_bc4::s_tran2
             [(ulong)(iVar36 <= iVar22) +
              (ulong)(iVar13 <= iVar22) +
              (ulong)(SBORROW4(iVar22,iVar14) == iVar22 + iVar36 * -5 < 0) +
              (ulong)(SBORROW4(iVar22,iVar12) == iVar22 + iVar36 * -7 < 0) +
              (ulong)(iVar15 <= iVar22) + (ulong)(iVar17 <= iVar22) + (ulong)(iVar16 <= iVar22)] <<
             0xc | encode_bc4::s_tran2
                   [(ulong)(iVar36 <= iVar19) +
                    (ulong)(SBORROW4(iVar19,iVar13) == iVar19 + iVar36 * -3 < 0) +
                    (ulong)(SBORROW4(iVar19,iVar14) == iVar19 + iVar36 * -5 < 0) +
                    (ulong)(SBORROW4(iVar19,iVar12) == iVar19 + iVar36 * -7 < 0) +
                    (ulong)(SBORROW4(iVar19,iVar15) == iVar19 + iVar36 * -9 < 0) +
                    (ulong)(iVar17 <= iVar19) + (ulong)(iVar16 <= iVar19)] |
             (encode_bc4::s_tran1
              [(ulong)(iVar36 <= iVar21) +
               (ulong)(iVar13 <= iVar21) +
               (ulong)(SBORROW4(iVar21,iVar14) == iVar21 + iVar36 * -5 < 0) +
               (ulong)(SBORROW4(iVar21,iVar12) == iVar21 + iVar36 * -7 < 0) +
               (ulong)(iVar15 <= iVar21) + (ulong)(iVar17 <= iVar21) + (ulong)(iVar16 <= iVar21)] |
             encode_bc4::s_tran0
             [(ulong)(iVar36 <= iVar31) +
              (ulong)(iVar13 <= iVar31) +
              (ulong)(SBORROW4(iVar31,iVar14) == iVar31 + iVar36 * -5 < 0) +
              (ulong)(SBORROW4(iVar31,iVar12) == iVar31 + iVar36 * -7 < 0) +
              (ulong)(iVar15 <= iVar31) + (ulong)(iVar17 <= iVar31) + (ulong)(iVar16 <= iVar31)]) <<
             0xc | encode_bc4::s_tran1
                   [(ulong)(iVar36 <= iVar18) +
                    (ulong)(SBORROW4(iVar18,iVar13) == iVar18 + iVar36 * -3 < 0) +
                    (ulong)(SBORROW4(iVar18,iVar14) == iVar18 + iVar36 * -5 < 0) +
                    (ulong)(SBORROW4(iVar18,iVar12) == iVar18 + iVar36 * -7 < 0) +
                    (ulong)(SBORROW4(iVar18,iVar15) == iVar18 + iVar36 * -9 < 0) +
                    (ulong)(iVar17 <= iVar18) + (ulong)(iVar16 <= iVar18)] |
             encode_bc4::s_tran0
             [(ulong)(iVar36 <= iVar29) +
              (ulong)(SBORROW4(iVar29,iVar13) == iVar29 + iVar36 * -3 < 0) +
              (ulong)(SBORROW4(iVar29,iVar14) == iVar29 + iVar36 * -5 < 0) +
              (ulong)(SBORROW4(iVar29,iVar12) == iVar29 + iVar36 * -7 < 0) +
              (ulong)(SBORROW4(iVar29,iVar15) == iVar29 + iVar36 * -9 < 0) +
              (ulong)(iVar17 <= iVar29) + (ulong)(iVar16 <= iVar29)];
    *(char *)((long)pDst + 2) = (char)uVar32;
    *(char *)((long)pDst + 3) = (char)(uVar32 >> 8);
    uVar28 = (ulong)(uVar7 | uVar35 | uVar8 | uVar9) << 0x24 | (ulong)uVar30 << 0x18;
    *(char *)((long)pDst + 4) = (char)(uVar32 >> 0x10);
    *(byte *)((long)pDst + 5) = (byte)(uVar32 >> 0x18) | (byte)uVar30;
    *(char *)((long)pDst + 6) = (char)(uVar28 >> 0x20);
    *(char *)((long)pDst + 7) = (char)(uVar28 >> 0x28);
  }
  return;
}

Assistant:

void encode_bc4(void* pDst, const uint8_t* pPixels, uint32_t stride)
	{
		assert(g_initialized);

		uint32_t min0_v, max0_v, min1_v, max1_v, min2_v, max2_v, min3_v, max3_v;

		{
			min0_v = max0_v = pPixels[0 * stride];
			min1_v = max1_v = pPixels[1 * stride];
			min2_v = max2_v = pPixels[2 * stride];
			min3_v = max3_v = pPixels[3 * stride];
		}

		{
			uint32_t v0 = pPixels[4 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[5 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[6 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[7 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		{
			uint32_t v0 = pPixels[8 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[9 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[10 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[11 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		{
			uint32_t v0 = pPixels[12 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[13 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[14 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[15 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		const uint32_t min_v = minimum(min0_v, min1_v, min2_v, min3_v);
		const uint32_t max_v = maximum(max0_v, max1_v, max2_v, max3_v);

		uint8_t* pDst_bytes = static_cast<uint8_t*>(pDst);
		pDst_bytes[0] = (uint8_t)max_v;
		pDst_bytes[1] = (uint8_t)min_v;

		if (max_v == min_v)
		{
			memset(pDst_bytes + 2, 0, 6);
			return;
		}

		const uint32_t delta = max_v - min_v;

		// min_v is now 0. Compute thresholds between values by scaling max_v. It's x14 because we're adding two x7 scale factors.
		const int t0 = delta * 13;
		const int t1 = delta * 11;
		const int t2 = delta * 9;
		const int t3 = delta * 7;
		const int t4 = delta * 5;
		const int t5 = delta * 3;
		const int t6 = delta * 1;

		// BC4 floors in its divisions, which we compensate for with the 4 bias.
		// This function is optimal for all possible inputs (i.e. it outputs the same results as checking all 8 values and choosing the closest one).
		const int bias = 4 - min_v * 14;

		static const uint32_t s_tran0[8] = { 1U      , 7U      , 6U      , 5U      , 4U      , 3U      , 2U      , 0U };
		static const uint32_t s_tran1[8] = { 1U << 3U, 7U << 3U, 6U << 3U, 5U << 3U, 4U << 3U, 3U << 3U, 2U << 3U, 0U << 3U };
		static const uint32_t s_tran2[8] = { 1U << 6U, 7U << 6U, 6U << 6U, 5U << 6U, 4U << 6U, 3U << 6U, 2U << 6U, 0U << 6U };
		static const uint32_t s_tran3[8] = { 1U << 9U, 7U << 9U, 6U << 9U, 5U << 9U, 4U << 9U, 3U << 9U, 2U << 9U, 0U << 9U };

		uint64_t a0, a1, a2, a3;
		{
			const int v0 = pPixels[0 * stride] * 14 + bias;
			const int v1 = pPixels[1 * stride] * 14 + bias;
			const int v2 = pPixels[2 * stride] * 14 + bias;
			const int v3 = pPixels[3 * stride] * 14 + bias;
			a0 = s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)];
			a1 = s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)];
			a2 = s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)];
			a3 = s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)];
		}

		{
			const int v0 = pPixels[4 * stride] * 14 + bias;
			const int v1 = pPixels[5 * stride] * 14 + bias;
			const int v2 = pPixels[6 * stride] * 14 + bias;
			const int v3 = pPixels[7 * stride] * 14 + bias;
			a0 |= (uint64_t)(s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)] << 12U);
			a1 |= (uint64_t)(s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)] << 12U);
			a2 |= (uint64_t)(s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)] << 12U);
			a3 |= (uint64_t)(s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)] << 12U);
		}

		{
			const int v0 = pPixels[8 * stride] * 14 + bias;
			const int v1 = pPixels[9 * stride] * 14 + bias;
			const int v2 = pPixels[10 * stride] * 14 + bias;
			const int v3 = pPixels[11 * stride] * 14 + bias;
			a0 |= (((uint64_t)s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)]) << 24U);
			a1 |= (((uint64_t)s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)]) << 24U);
			a2 |= (((uint64_t)s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)]) << 24U);
			a3 |= (((uint64_t)s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)]) << 24U);
		}

		{
			const int v0 = pPixels[12 * stride] * 14 + bias;
			const int v1 = pPixels[13 * stride] * 14 + bias;
			const int v2 = pPixels[14 * stride] * 14 + bias;
			const int v3 = pPixels[15 * stride] * 14 + bias;
			a0 |= (((uint64_t)s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)]) << 36U);
			a1 |= (((uint64_t)s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)]) << 36U);
			a2 |= (((uint64_t)s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)]) << 36U);
			a3 |= (((uint64_t)s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)]) << 36U);
		}

		const uint64_t f = a0 | a1 | a2 | a3;

		pDst_bytes[2] = (uint8_t)f;
		pDst_bytes[3] = (uint8_t)(f >> 8U);
		pDst_bytes[4] = (uint8_t)(f >> 16U);
		pDst_bytes[5] = (uint8_t)(f >> 24U);
		pDst_bytes[6] = (uint8_t)(f >> 32U);
		pDst_bytes[7] = (uint8_t)(f >> 40U);
	}